

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_sched_perf.cpp
# Opt level: O2

void process_arguments(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  
  do {
    iVar1 = getopt(argc,argv,"chN:n:pq:sT:t:v:");
    switch(iVar1) {
    case 99:
      ClearCaches = true;
      break;
    case 100:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6f:
    case 0x72:
    case 0x75:
switchD_0010dbbc_caseD_64:
      fprintf(_stderr,"Unknown argument %c. Try -h\n",(ulong)(uint)(int)(char)iVar1);
      break;
    case 0x68:
      show_help();
      exit(0);
    case 0x6e:
      uVar2 = strtoul(_optarg,(char **)0x0,0);
      NReps = (int)uVar2;
      break;
    case 0x70:
      ParallelBaseline = true;
      break;
    case 0x71:
      uVar2 = strtoul(_optarg,(char **)0x0,0);
      Queue_limit = (int)uVar2;
      break;
    case 0x73:
      UseSameTile = true;
      break;
    case 0x74:
      uVar2 = strtoul(_optarg,(char **)0x0,0);
      Nthreads = (int)uVar2;
      break;
    case 0x76:
      uVar2 = strtoul(_optarg,(char **)0x0,0);
      Verbosity = (int)uVar2;
      break;
    default:
      if (iVar1 == 0x4e) {
        uVar2 = strtoul(_optarg,(char **)0x0,0);
        if ((ulong)(long)(int)uVar2 < 0x4000) {
          MaxNTasks = (long)(int)uVar2;
        }
      }
      else if (iVar1 == 0x50) {
        OnlyParallelRun = true;
      }
      else {
        if (iVar1 != 0x54) {
          if (iVar1 == -1) {
            return;
          }
          goto switchD_0010dbbc_caseD_64;
        }
        MaxTileSize = strtoul(_optarg,(char **)0x0,0);
        if (0x3fff < MaxTileSize) {
          MaxTileSize = 0x4000;
        }
      }
    }
  } while( true );
}

Assistant:

void process_arguments(int argc, char **argv)
{ int c;

  while ( -1 != (c = getopt(argc, argv, "chN:n:pq:sT:t:v:")) ) {
    switch (c) {
      case 'c':
        ClearCaches = true;
        break;
      case 'h':
        show_help();
        exit(0);
        break;
      case 'N':
        c = strtoul(optarg, 0, 0);
        if (c < MAX_NTASKS) {
          MaxNTasks = c;
        }
        break;
      case 'n':
        NReps = strtoul(optarg, 0, 0);
        break;
      case 'P':
        OnlyParallelRun = true;
        break;
      case 'p':
        ParallelBaseline = true;
        break;
      case 'q' : /* queue limit */
        Queue_limit = strtoul(optarg, 0, 0);
        break;
      case 's':
        UseSameTile = true;
        break;
      case 'T':
        MaxTileSize = std::min(strtoul(optarg, 0, 0), MAX_NTASKS);
        break;
      case 't':
        Nthreads = strtoul(optarg, 0, 0);
        break;
      case 'v':
        Verbosity = strtoul(optarg, 0, 0);
        break;
      default:
        fprintf(stderr, "Unknown argument %c. Try -h\n", (char)c);
    }
  }
}